

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSymbols.cpp
# Opt level: O0

VariableSymbol *
slang::ast::VariableSymbol::fromSyntax
          (Compilation *compilation,ForVariableDeclarationSyntax *syntax,VariableSymbol *lastVar)

{
  DeclaratorSyntax *pDVar1;
  BumpAllocator *this;
  SourceLocation args;
  VariableSymbol *pVVar2;
  DeclaredType *target;
  long in_RSI;
  string_view sVar3;
  VariableSymbol *var;
  Token nameToken;
  ValueSymbol *in_stack_ffffffffffffff88;
  VariableSymbol *decl;
  ValueSymbol *in_stack_ffffffffffffff90;
  Token *in_stack_ffffffffffffffa0;
  VariableLifetime *in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffb0;
  Token local_28;
  long local_10;
  
  local_10 = in_RSI;
  pDVar1 = not_null<slang::syntax::DeclaratorSyntax_*>::operator->
                     ((not_null<slang::syntax::DeclaratorSyntax_*> *)0x471fd1);
  local_28.kind = (pDVar1->name).kind;
  local_28._2_1_ = (pDVar1->name).field_0x2;
  local_28.numFlags.raw = (pDVar1->name).numFlags.raw;
  local_28.rawLen = (pDVar1->name).rawLen;
  local_28.info = (pDVar1->name).info;
  sVar3 = parsing::Token::valueText(in_stack_ffffffffffffffa0);
  this = (BumpAllocator *)sVar3._M_len;
  args = parsing::Token::location(&local_28);
  pVVar2 = BumpAllocator::
           emplace<slang::ast::VariableSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::VariableLifetime>
                     (this,(basic_string_view<char,_std::char_traits<char>_> *)args,
                      (SourceLocation *)(ulong)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if (*(long *)(local_10 + 0x28) == 0) {
    ValueSymbol::getDeclaredType(in_stack_ffffffffffffff88);
    in_stack_ffffffffffffff90 =
         (ValueSymbol *)
         not_null<slang::ast::DeclaredType_*>::operator->
                   ((not_null<slang::ast::DeclaredType_*> *)0x472074);
    ValueSymbol::getDeclaredType(in_stack_ffffffffffffff88);
    target = not_null<const_slang::ast::DeclaredType_*>::operator*
                       ((not_null<const_slang::ast::DeclaredType_*> *)0x472092);
    DeclaredType::setLink((DeclaredType *)in_stack_ffffffffffffff90,target);
  }
  else {
    ValueSymbol::setDeclaredType
              (in_stack_ffffffffffffff90,(DataTypeSyntax *)in_stack_ffffffffffffff88);
  }
  decl = pVVar2;
  not_null<slang::syntax::DeclaratorSyntax_*>::operator*
            ((not_null<slang::syntax::DeclaratorSyntax_*> *)0x4720b6);
  ValueSymbol::setFromDeclarator(in_stack_ffffffffffffff90,(DeclaratorSyntax *)decl);
  return pVVar2;
}

Assistant:

VariableSymbol& VariableSymbol::fromSyntax(Compilation& compilation,
                                           const ForVariableDeclarationSyntax& syntax,
                                           const VariableSymbol* lastVar) {
    auto nameToken = syntax.declarator->name;
    auto var = compilation.emplace<VariableSymbol>(nameToken.valueText(), nameToken.location(),
                                                   VariableLifetime::Automatic);

    if (syntax.type)
        var->setDeclaredType(*syntax.type);
    else {
        SLANG_ASSERT(lastVar);
        var->getDeclaredType()->setLink(*lastVar->getDeclaredType());
    }

    var->setFromDeclarator(*syntax.declarator);
    return *var;
}